

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O3

bool __thiscall
CppUnit::TestResult::protect(TestResult *this,Functor *functor,Test *test,string *shortDescription)

{
  size_type *psVar1;
  pointer pcVar2;
  int iVar3;
  Test *local_50;
  ProtectorContext context;
  
  psVar1 = &context.m_shortDescription._M_string_length;
  pcVar2 = (shortDescription->_M_dataplus)._M_p;
  local_50 = test;
  context.m_test = (Test *)this;
  context.m_result = (TestResult *)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&context.m_result,pcVar2,pcVar2 + shortDescription->_M_string_length);
  iVar3 = (*(this->m_protectorChain->super_Protector)._vptr_Protector[2])
                    (this->m_protectorChain,functor,&local_50);
  if (context.m_result != (TestResult *)psVar1) {
    operator_delete(context.m_result,context.m_shortDescription._M_string_length + 1);
  }
  return SUB41(iVar3,0);
}

Assistant:

bool 
TestResult::protect( const Functor &functor,
                     Test *test,
                     const std::string &shortDescription )
{
  ProtectorContext context( test, this, shortDescription );
  return m_protectorChain->protect( functor, context );
}